

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O1

void fix_reloc_addends(GlobalVars *gv,LinkedSection *ls)

{
  Reloc *r;
  node *pnVar1;
  
  r = (Reloc *)(ls->relocs).first;
  pnVar1 = (r->n).next;
  while (pnVar1 != (node *)0x0) {
    writesection(gv,ls->data + r->offset,r,r->addend);
    r = (Reloc *)(r->n).next;
    pnVar1 = (r->n).next;
  }
  return;
}

Assistant:

static void fix_reloc_addends(struct GlobalVars *gv,struct LinkedSection *ls)
{
  struct Reloc *rel;

  for (rel=(struct Reloc *)ls->relocs.first;
       rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
    writesection(gv,ls->data+rel->offset,rel,rel->addend);
  }
}